

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_set(t_radio *x,t_floatarg f)

{
  int iVar1;
  int local_18;
  int old;
  int i;
  t_floatarg f_local;
  t_radio *x_local;
  
  local_18 = (int)f;
  x->x_fval = f;
  if (local_18 < 0) {
    local_18 = 0;
  }
  if (x->x_number <= local_18) {
    local_18 = x->x_number + -1;
  }
  if (x->x_on == x->x_on_old) {
    x->x_on = local_18;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  }
  else {
    iVar1 = x->x_on_old;
    x->x_on_old = x->x_on;
    x->x_on = local_18;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    x->x_on_old = iVar1;
  }
  return;
}

Assistant:

static void radio_set(t_radio *x, t_floatarg f)
{
    int i = (int)f;

    x->x_fval = f;
    if(i < 0)
        i = 0;
    if(i >= x->x_number)
        i = x->x_number - 1;
    if(x->x_on != x->x_on_old)
    {
        int old = x->x_on_old;
        x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        x->x_on_old = old;
    }
    else
    {
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    }
}